

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_float_2_suite::test_same(void)

{
  undefined4 local_98;
  value_type_conflict local_94 [2];
  undefined4 local_8c;
  size_type local_88;
  undefined1 local_7e;
  undefined1 local_7d [2];
  undefined1 local_7b;
  undefined1 local_7a [2];
  undefined4 local_78;
  value_type_conflict local_74 [2];
  undefined4 local_6c;
  size_type local_68 [2];
  undefined8 local_58;
  value_type_conflict local_4c [2];
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  moment<float,_2> filter;
  
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push
            ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30,1.0);
  local_40[0] = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::size
                          ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_44 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x14d,"void mean_float_2_suite::test_same()",local_40,&local_44);
  local_4c[0] = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_58 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x14e,"void mean_float_2_suite::test_same()",local_4c,&local_58);
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push
            ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30,1.0);
  local_68[0] = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::size
                          ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x150,"void mean_float_2_suite::test_same()",local_68,&local_6c);
  local_74[0] = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_78 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x151,"void mean_float_2_suite::test_same()",local_74,&local_78);
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push
            ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30,1.0);
  local_7a[0] = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::empty
                          ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_7b = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x153,"void mean_float_2_suite::test_same()",local_7a,&local_7b);
  local_7d[0] = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::full
                          ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_7e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x154,"void mean_float_2_suite::test_same()",local_7d,&local_7e);
  local_88 = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_8c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x155,"void mean_float_2_suite::test_same()",&local_88,&local_8c);
  local_94[0] = trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<float,_2UL,_(trial::online::with)1> *)local_30);
  local_98 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x156,"void mean_float_2_suite::test_same()",local_94,&local_98);
  return;
}

Assistant:

void test_same()
{
    window::moment<float, 2> filter;
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
}